

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O0

void __thiscall
duckdb::Serializer::
WriteValue<duckdb::unique_ptr<duckdb::Complex,std::default_delete<duckdb::Complex>,true>>
          (Serializer *this,
          vector<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>,_true>
          *vec)

{
  bool bVar1;
  vector<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>_>_>
  *in_RSI;
  Serializer *in_RDI;
  unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true> *item;
  const_iterator __end0;
  const_iterator __begin0;
  vector<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>,_true>
  *__range2;
  size_type count;
  vector<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>_>_>
  *in_stack_ffffffffffffffb8;
  __normal_iterator<const_duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>_>_>_>
  local_28;
  vector<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>_>_>
  *local_20;
  size_type local_18;
  vector<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>_>_>
  *local_10;
  
  local_10 = in_RSI;
  local_18 = std::
             vector<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>_>_>
             ::size(in_RSI);
  (*(code *)((unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true> *)
            in_RDI->_vptr_Serializer)[8].
            super_unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>_>._M_t.
            super___uniq_ptr_impl<duckdb::Complex,_std::default_delete<duckdb::Complex>_>._M_t.
            super__Tuple_impl<0UL,_duckdb::Complex_*,_std::default_delete<duckdb::Complex>_>.
            super__Head_base<0UL,_duckdb::Complex_*,_false>._M_head_impl)(in_RDI,local_18);
  local_20 = local_10;
  local_28._M_current =
       (unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true> *)
       std::
       vector<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>_>_>
       ::begin(in_stack_ffffffffffffffb8);
  std::
  vector<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>_>_>
  ::end(in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>_>_>_>
                        *)in_RDI,
                       (__normal_iterator<const_duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>_>_>_>
                        *)in_stack_ffffffffffffffb8);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>_>_>_>
    ::operator*(&local_28);
    WriteValue<duckdb::Complex>
              (in_RDI,(unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true> *)
                      in_stack_ffffffffffffffb8);
    __gnu_cxx::
    __normal_iterator<const_duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>_>_>_>
    ::operator++(&local_28);
  }
  (*(code *)((unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true> *)
            in_RDI->_vptr_Serializer)[9].
            super_unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>_>._M_t.
            super___uniq_ptr_impl<duckdb::Complex,_std::default_delete<duckdb::Complex>_>._M_t.
            super__Tuple_impl<0UL,_duckdb::Complex_*,_std::default_delete<duckdb::Complex>_>.
            super__Head_base<0UL,_duckdb::Complex_*,_false>._M_head_impl)();
  return;
}

Assistant:

void WriteValue(const vector<T> &vec) {
		auto count = vec.size();
		OnListBegin(count);
		for (auto &item : vec) {
			WriteValue(item);
		}
		OnListEnd();
	}